

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *string;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uStack_60;
  char buf [16];
  
  if ((input_number < 0.0) ||
     (((input_number == 0.0 && (!NAN(input_number))) && (1.0 / input_number < 0.0)))) {
    uStack_60 = 0x101808;
    putchar(0x2d);
    input_number = -input_number;
  }
  if ((input_number != 0.0) || (NAN(input_number))) {
    if (NAN(input_number)) {
      string = "nan";
    }
    else {
      if (ABS(input_number) != INFINITY) {
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        iVar8 = 0;
        for (; input_number < 0.1; input_number = input_number * 1e+06) {
          iVar8 = iVar8 + -6;
        }
        for (; input_number < 100000.0; input_number = input_number * 10.0) {
          iVar8 = iVar8 + -1;
        }
        for (; 1e+12 < input_number; input_number = input_number / 1e+06) {
          iVar8 = iVar8 + 6;
        }
        for (; 1e+06 < input_number; input_number = input_number / 10.0) {
          iVar8 = iVar8 + 1;
        }
        iVar3 = (int)(input_number + input_number);
        uVar1 = (uint)(0x1e847e < iVar3);
        uVar4 = 100000;
        if (iVar3 < 1999999) {
          uVar4 = (long)(iVar3 + 1) / 2 & 0xffffffff;
        }
        uVar6 = 5;
        uVar2 = uVar6;
        if (uVar1 + iVar8 + 9 < 10) {
          uVar6 = (ulong)-(uVar1 + iVar8);
          uVar2 = uVar6;
        }
        while( true ) {
          if (((int)uVar6 < 1) || ((int)uVar4 % 10 != 0)) break;
          uVar6 = uVar6 - 1;
          uVar4 = (long)(int)uVar4 / 10 & 0xffffffff;
        }
        for (uVar9 = 0; (iVar3 = (int)uVar4, iVar3 != 0 || ((long)uVar9 <= (long)(int)uVar6));
            uVar9 = uVar9 + 1) {
          buf[uVar9] = (char)(iVar3 % 10) + '0';
          uVar4 = (long)iVar3 / 10 & 0xffffffff;
        }
        lVar7 = uVar6 - uVar9;
        while (0 < (long)uVar9) {
          if (lVar7 == 0) {
            uStack_60 = 0x10195a;
            putchar(0x2e);
          }
          uVar9 = uVar9 - 1;
          uStack_60 = 0x101969;
          putchar((int)buf[uVar9 & 0xffffffff]);
          lVar7 = lVar7 + 1;
        }
        uVar5 = (int)uVar2 + uVar1 + iVar8;
        if (uVar5 != 0) {
          uStack_60 = 0x101984;
          putchar(0x65);
          if ((int)uVar5 < 0) {
            uStack_60 = 0x10199a;
            putchar(0x2d);
            uVar5 = -((int)uVar2 + uVar1 + iVar8);
          }
          else {
            uStack_60 = 0x101990;
            putchar(0x2b);
          }
          for (uVar4 = 0; uVar4 < 2 || uVar5 != 0; uVar4 = uVar4 + 1) {
            uVar2 = (ulong)uVar5;
            uVar5 = uVar5 / 10;
            buf[uVar4] = (byte)(uVar2 % 10) | 0x30;
          }
          for (; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
            uStack_60 = 0x1019db;
            putchar((int)buf[uVar4 - 1]);
          }
        }
        return;
      }
      string = "inf";
    }
  }
  else {
    string = "0";
  }
  UnityPrint(string);
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < 0.0f || (number == 0.0f && 1.0f / number < 0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16] = {0};

        /* scale up or down by powers of 10 */
        while (number < 100000.0f / 1e6f)  { number *= 1e6f; exponent -= 6; }
        while (number < 100000.0f)         { number *= 10.0f; exponent--; }
        while (number > 1000000.0f * 1e6f) { number /= 1e6f; exponent += 6; }
        while (number > 1000000.0f)        { number /= 10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}